

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

RectangleNode * rengine::RectangleNode::create(void)

{
  undefined1 *puVar1;
  RectangleNode *this;
  
  if (__allocation_pool_rengine_RectangleNode.m_nextFree <
      __allocation_pool_rengine_RectangleNode.m_poolSize) {
    this = AllocationPool<rengine::RectangleNode>::allocate
                     (&__allocation_pool_rengine_RectangleNode);
    puVar1 = &(this->super_RectangleNodeBase).super_Node.field_0x31;
    *puVar1 = *puVar1 | 2;
  }
  else {
    this = (RectangleNode *)operator_new(0x58);
    RectangleNode(this,RectangleNodeType);
  }
  return this;
}

Assistant:

static RectangleNode *create(rect2d geometry, vec4 color = vec4()) {
        auto node = create();
        node->setGeometry(geometry);
        node->setColor(color);
        return node;
    }